

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O2

BoolExpr * BO_or(List *ls)

{
  BoolExpr *pBVar1;
  BoolExpr *pBVar2;
  bool bVar3;
  
  pBVar1 = create_bool_expr(E_OR,(BoolExpr *)0x0);
  bVar3 = true;
  while( true ) {
    while( true ) {
      ls = ls->cdr;
      if (ls == (List *)0x0) {
        pBVar2 = pBVar1->subexpr;
        if (pBVar2 == (BoolExpr *)0x0) {
          pBVar1 = &false_bool_expr;
          if (bVar3) {
            parse_error((List *)0x0,"or takes arguments!\n");
          }
        }
        else if (pBVar2->next == (BoolExprStruct *)0x0) {
          pBVar1 = pBVar2;
        }
        return pBVar1;
      }
      pBVar2 = make_boolean_expr(ls);
      if (pBVar2->type != E_FALSE) break;
      bVar3 = false;
    }
    if (pBVar2->type == E_TRUE) break;
    pBVar2->next = pBVar1->subexpr;
    pBVar1->subexpr = pBVar2;
  }
  return &true_bool_expr;
}

Assistant:

static BoolExpr *
BO_or (const List *ls)
{
  BOOL hit_false = FALSE;
  BoolExpr *subexpr, *ret;

  ret = create_bool_expr (E_OR, NULL);
  while ((ls = ls->cdr))
    {
      subexpr = make_boolean_expr (ls);
      if (subexpr->type == E_TRUE)
	return &true_bool_expr;
      if (subexpr->type == E_FALSE)  /* No sense adding in FALSE statements*/
	hit_false = TRUE;
      else
	{
	  subexpr->next = ret->subexpr;
	  ret->subexpr = subexpr;
	}
    }
  if (ret->subexpr == NULL)
    {
      if (hit_false)   /* If we hit nothing but FALSE's return FALSE */
	return &false_bool_expr;
      parse_error(ls, "or takes arguments!\n");
      return &false_bool_expr;   /* Default = FALSE */
    }
  
  if (ret->subexpr->next == NULL) /* (or a) == a */
    return ret->subexpr;
  
  return ret;
}